

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfunc.cpp
# Opt level: O2

char * __thiscall CVmDbgFrameSymPtr::get_symptr(CVmDbgFrameSymPtr *this)

{
  uint *puVar1;
  
  puVar1 = (uint *)(this->p_ + G_dbg_lclsym_hdr_size_X);
  if ((this->p_[2] & 4) != 0) {
    puVar1 = (uint *)(G_const_pool_X.super_CVmPoolPaged.pages_
                      [*puVar1 >> ((byte)G_const_pool_X.super_CVmPoolPaged.log2_page_size_ & 0x1f)].
                      mem + (G_const_pool_X.super_CVmPoolPaged._8_4_ - 1 & *puVar1));
  }
  return (char *)puVar1;
}

Assistant:

const char *CVmDbgFrameSymPtr::get_symptr(VMG0_) const
{
    /* get a pointer to the symbol field in this record */
    const char *symp = (const char *)p_ + G_dbg_lclsym_hdr_size;

    /* 
     *   if it's stored inline, this points directly to the symbol data;
     *   otherwise it's a constant pool offset pointing to the symbol data 
     */
    if (is_sym_inline())
        return symp;
    else
        return G_const_pool->get_ptr(osrp4(symp));
}